

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  BYTE *pStart;
  ulong uVar14;
  ulong *puVar15;
  byte bVar16;
  ulong *puVar17;
  ulong *puVar18;
  int *piVar19;
  ulong *puVar20;
  long lVar21;
  ulong *puVar22;
  int iVar23;
  uint uVar24;
  int *piVar25;
  uint uVar26;
  uint uVar27;
  ulong *puVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  int *piVar34;
  ulong uVar35;
  int iVar36;
  U32 UVar37;
  BYTE *litEnd;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  BYTE *iend;
  BYTE *base;
  BYTE *pInLoopLimit;
  BYTE *ilimit;
  BYTE *pInLoopLimit_6;
  BYTE *litLimit_w;
  BYTE *litLimit_w_4;
  U32 prefixStartIndex;
  U32 *hashTable;
  BYTE *prefixStart;
  size_t stepSize;
  uint local_dc;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3da5,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar27 = (ms->cParams).minMatch;
  uVar6 = (ms->cParams).targetLength;
  uVar14 = (ulong)(uVar6 + 1 + (uint)(uVar6 == 0));
  pBVar7 = (ms->window).base;
  puVar2 = (ulong *)((long)src + srcSize);
  iVar36 = (int)pBVar7;
  iVar23 = (int)puVar2 - iVar36;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar6 = (ms->window).dictLimit;
  uVar11 = iVar23 - uVar13;
  if (iVar23 - uVar6 <= uVar13) {
    uVar11 = uVar6;
  }
  pUVar8 = ms->hashTable;
  piVar25 = (int *)(pBVar7 + uVar11);
  uVar6 = *rep;
  uVar13 = rep[1];
  puVar20 = (ulong *)((ulong)(piVar25 == (int *)src) + (long)src);
  uVar26 = (int)puVar20 - (int)piVar25;
  uVar39 = (ulong)uVar13;
  if (uVar26 < uVar13) {
    uVar39 = 0;
  }
  uVar38 = (uint)uVar39;
  uVar24 = 0;
  if (uVar6 <= uVar26) {
    uVar24 = uVar6;
  }
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  puVar15 = (ulong *)((long)src + (ulong)(piVar25 == (int *)src) + 1);
  puVar22 = (ulong *)src;
  if (uVar27 == 5) {
    if (puVar15 < puVar4) {
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar17 = puVar2 + -4;
      do {
        uVar33 = *puVar20 * -0x30e4432345000000 >> (bVar16 & 0x3f);
        uVar40 = *puVar15 * -0x30e4432345000000 >> (bVar16 & 0x3f);
        uVar35 = *puVar20;
        uVar30 = *puVar15;
        uVar31 = (long)puVar20 - (long)pBVar7;
        uVar27 = pUVar8[uVar33];
        uVar38 = pUVar8[uVar40];
        UVar37 = (U32)uVar31;
        pUVar8[uVar33] = UVar37;
        pUVar8[uVar40] = (int)puVar15 - iVar36;
        if ((ulong *)((long)puVar20 + 1U) != puVar15) goto LAB_00112abe;
        if (uVar24 == 0) {
LAB_00111dca:
          if (((uVar11 < uVar27) &&
              (piVar34 = (int *)(pBVar7 + uVar27), puVar18 = puVar20, *piVar34 == (int)uVar35)) ||
             ((uVar11 < uVar38 &&
              (piVar34 = (int *)(pBVar7 + uVar38), puVar18 = puVar15, *piVar34 == (int)uVar30)))) {
            uVar27 = (int)puVar18 - (int)piVar34;
            iVar23 = uVar27 + 2;
            local_dc = uVar24;
            if ((piVar25 < piVar34) && (puVar22 < puVar18)) {
              uVar35 = 0;
              do {
                piVar19 = (int *)((long)piVar34 + -1);
                puVar20 = (ulong *)((long)puVar18 + -1);
                if ((*(char *)puVar20 != *(char *)piVar19) ||
                   (uVar35 = uVar35 + 1, piVar34 = piVar19, puVar18 = puVar20, piVar19 <= piVar25))
                break;
              } while (puVar22 < puVar20);
            }
            else {
              uVar35 = 0;
            }
            goto LAB_00111e95;
          }
          uVar35 = ((ulong)((long)puVar20 - (long)puVar22) >> 7) + uVar14;
          if (uVar35 < 2) goto LAB_00112b1b;
          puVar20 = (ulong *)((long)puVar20 + uVar35);
          puVar15 = (ulong *)((long)puVar15 + uVar35);
        }
        else {
          piVar19 = (int *)((long)puVar20 + 2);
          piVar34 = (int *)((long)piVar19 - (ulong)uVar24);
          if (*piVar34 != *piVar19) goto LAB_00111dca;
          uVar35 = (ulong)(*(char *)((long)puVar20 + 1U) == *(char *)((long)piVar34 + -1));
          iVar23 = 0;
          piVar34 = (int *)((long)piVar34 - uVar35);
          puVar18 = (ulong *)((long)piVar19 - uVar35);
          local_dc = (uint)uVar39;
          uVar27 = uVar24;
LAB_00111e95:
          uVar24 = uVar27;
          puVar15 = (ulong *)((long)puVar18 + uVar35 + 4);
          puVar28 = (ulong *)((long)piVar34 + uVar35 + 4);
          puVar20 = puVar15;
          if (puVar15 < puVar1) {
            uVar30 = *puVar15 ^ *puVar28;
            uVar39 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar39 = uVar39 >> 3 & 0x1fffffff;
            if (*puVar28 == *puVar15) {
              puVar20 = (ulong *)((long)puVar18 + uVar35 + 0xc);
              puVar28 = (ulong *)((long)piVar34 + uVar35 + 0xc);
              do {
                if (puVar1 <= puVar20) goto LAB_00111f14;
                uVar30 = *puVar28;
                uVar33 = *puVar20;
                uVar40 = uVar33 ^ uVar30;
                uVar39 = 0;
                if (uVar40 != 0) {
                  for (; (uVar40 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = (long)puVar20 + ((uVar39 >> 3 & 0x1fffffff) - (long)puVar15);
                puVar20 = puVar20 + 1;
                puVar28 = puVar28 + 1;
              } while (uVar30 == uVar33);
            }
          }
          else {
LAB_00111f14:
            if ((puVar20 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar28 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar28 = (ulong *)((long)puVar28 + 4);
            }
            if ((puVar20 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar28 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar28 = (ulong *)((long)puVar28 + 2);
            }
            if (puVar20 < puVar2) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar28 == (char)*puVar20));
            }
            uVar39 = (long)puVar20 - (long)puVar15;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00112a23;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
          uVar30 = (long)puVar18 - (long)puVar22;
          puVar20 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar30))
          goto LAB_00112a42;
          if (puVar2 < puVar18) goto LAB_00112a61;
          if (puVar17 < puVar18) {
            ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)puVar22,(BYTE *)puVar18,(BYTE *)puVar17);
          }
          else {
            uVar33 = puVar22[1];
            *puVar20 = *puVar22;
            puVar20[1] = uVar33;
            if (0x10 < uVar30) {
              pBVar9 = seqStore->lit;
              puVar20 = (ulong *)(pBVar9 + 0x10);
              puVar15 = puVar22 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar20 + (-8 - (long)puVar15)))
              goto LAB_00112b3a;
              if (0xffffffffffffffe0 < (ulong)((long)puVar20 + (-0x10 - (long)puVar15)))
              goto LAB_00112b59;
              uVar33 = puVar22[3];
              *puVar20 = *puVar15;
              *(ulong *)(pBVar9 + 0x18) = uVar33;
              if (0x20 < (long)uVar30) {
                lVar21 = 0;
                do {
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x20);
                  uVar12 = puVar5[1];
                  pBVar3 = pBVar9 + lVar21 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar12;
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x30);
                  uVar12 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar12;
                  lVar21 = lVar21 + 0x20;
                } while (pBVar3 + 0x20 < pBVar9 + uVar30);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) goto LAB_00112add;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = uVar35 + uVar39 + 1;
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar30;
          psVar10->offset = iVar23 + 1;
          if (0xffff < uVar33) {
            if (seqStore->longLengthID != 0) goto LAB_00112a9f;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->matchLength = (U16)uVar33;
          seqStore->sequences = psVar10 + 1;
          puVar20 = (ulong *)((long)puVar18 + uVar35 + uVar39 + 4);
          puVar15 = (ulong *)((long)puVar18 + uVar35 + uVar39 + 5);
          puVar22 = puVar20;
          if (puVar4 < puVar20) {
            uVar39 = (ulong)local_dc;
          }
          else {
            uVar39 = (ulong)local_dc;
            if (pBVar7 + (uVar31 & 0xffffffff) + 2 <= src) goto LAB_00112afc;
            pUVar8[(ulong)(*(long *)(pBVar7 + (uVar31 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar16 & 0x3f)] = UVar37 + 2;
            pUVar8[(ulong)(*(long *)((long)puVar20 - 2) * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
                 ((int)puVar20 + -2) - iVar36;
            if (((local_dc != 0) && (puVar20 <= puVar4)) &&
               (uVar27 = uVar24, uVar35 = uVar39, (int)*puVar20 == *(int *)((long)puVar20 - uVar39))
               ) {
              do {
                uVar24 = local_dc;
                local_dc = uVar27;
                puVar15 = puVar20;
                uVar39 = (ulong)local_dc;
                puVar20 = (ulong *)((long)puVar15 + 4);
                puVar18 = (ulong *)((long)puVar15 + (4 - uVar35));
                puVar22 = puVar20;
                if (puVar20 < puVar1) {
                  uVar33 = *puVar20 ^ *puVar18;
                  uVar30 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                  if (*puVar18 == *puVar20) {
                    puVar22 = (ulong *)((long)puVar15 + 0xc);
                    puVar18 = (ulong *)((long)puVar15 + (0xc - uVar35));
                    do {
                      if (puVar1 <= puVar22) goto LAB_00112201;
                      uVar35 = *puVar18;
                      uVar33 = *puVar22;
                      uVar40 = uVar33 ^ uVar35;
                      uVar30 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      uVar30 = (long)puVar22 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar20);
                      puVar22 = puVar22 + 1;
                      puVar18 = puVar18 + 1;
                    } while (uVar35 == uVar33);
                  }
                }
                else {
LAB_00112201:
                  if ((puVar22 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar18 == (int)*puVar22))
                  {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar18 = (ulong *)((long)puVar18 + 4);
                  }
                  if ((puVar22 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar18 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar18 = (ulong *)((long)puVar18 + 2);
                  }
                  if (puVar22 < puVar2) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar18 == (char)*puVar22));
                  }
                  uVar30 = (long)puVar22 - (long)puVar20;
                }
                pUVar8[*puVar15 * -0x30e4432345000000 >> (bVar16 & 0x3f)] = (int)puVar15 - iVar36;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_00112a23;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
                puVar20 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_00112a42;
                if (puVar2 < puVar15) goto LAB_00112a61;
                if (puVar17 < puVar15) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar20,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar17);
                }
                else {
                  uVar35 = puVar15[1];
                  *puVar20 = *puVar15;
                  puVar20[1] = uVar35;
                }
                psVar10 = seqStore->sequences;
                psVar10->litLength = 0;
                psVar10->offset = 1;
                if (0xffff < uVar30 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_00112a9f;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar20 = (ulong *)((long)puVar15 + uVar30 + 4);
                psVar10->matchLength = (U16)(uVar30 + 1);
                seqStore->sequences = psVar10 + 1;
              } while (((local_dc != 0) && (puVar20 <= puVar4)) &&
                      (uVar27 = uVar24, uVar35 = uVar39,
                      (int)*puVar20 == *(int *)((long)puVar20 - uVar39)));
              puVar15 = (ulong *)((long)puVar15 + uVar30 + 5);
              puVar22 = puVar20;
            }
          }
        }
        uVar38 = (uint)uVar39;
      } while (puVar15 < puVar4);
    }
  }
  else if (uVar27 == 6) {
    if (puVar15 < puVar4) {
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar17 = puVar2 + -4;
      do {
        local_dc = (uint)uVar39;
        uVar30 = *puVar20 * -0x30e4432340650000 >> (bVar16 & 0x3f);
        uVar33 = *puVar15 * -0x30e4432340650000 >> (bVar16 & 0x3f);
        uVar39 = *puVar20;
        uVar35 = *puVar15;
        uVar40 = (long)puVar20 - (long)pBVar7;
        uVar27 = pUVar8[uVar30];
        uVar38 = pUVar8[uVar33];
        UVar37 = (U32)uVar40;
        pUVar8[uVar30] = UVar37;
        pUVar8[uVar33] = (int)puVar15 - iVar36;
        if ((ulong *)((long)puVar20 + 1U) != puVar15) goto LAB_00112abe;
        if (uVar24 == 0) {
LAB_0011172f:
          if (((uVar11 < uVar27) &&
              (piVar34 = (int *)(pBVar7 + uVar27), puVar18 = puVar20, *piVar34 == (int)uVar39)) ||
             ((uVar11 < uVar38 &&
              (piVar34 = (int *)(pBVar7 + uVar38), puVar18 = puVar15, *piVar34 == (int)uVar35)))) {
            uVar27 = (int)puVar18 - (int)piVar34;
            iVar23 = uVar27 + 2;
            local_dc = uVar24;
            if ((piVar25 < piVar34) && (puVar22 < puVar18)) {
              uVar39 = 0;
              do {
                piVar19 = (int *)((long)piVar34 + -1);
                puVar20 = (ulong *)((long)puVar18 + -1);
                if ((*(char *)puVar20 != *(char *)piVar19) ||
                   (uVar39 = uVar39 + 1, piVar34 = piVar19, puVar18 = puVar20, piVar19 <= piVar25))
                break;
              } while (puVar22 < puVar20);
            }
            else {
              uVar39 = 0;
            }
            goto LAB_001117f5;
          }
          uVar39 = ((ulong)((long)puVar20 - (long)puVar22) >> 7) + uVar14;
          if (uVar39 < 2) goto LAB_00112b1b;
          puVar20 = (ulong *)((long)puVar20 + uVar39);
          puVar15 = (ulong *)((long)puVar15 + uVar39);
LAB_00111a4c:
          uVar39 = (ulong)local_dc;
        }
        else {
          piVar19 = (int *)((long)puVar20 + 2);
          piVar34 = (int *)((long)piVar19 - (ulong)uVar24);
          if (*piVar34 != *piVar19) goto LAB_0011172f;
          uVar39 = (ulong)(*(char *)((long)puVar20 + 1U) == *(char *)((long)piVar34 + -1));
          iVar23 = 0;
          piVar34 = (int *)((long)piVar34 - uVar39);
          puVar18 = (ulong *)((long)piVar19 - uVar39);
          uVar27 = uVar24;
LAB_001117f5:
          uVar24 = uVar27;
          puVar15 = (ulong *)((long)puVar18 + uVar39 + 4);
          puVar28 = (ulong *)((long)piVar34 + uVar39 + 4);
          puVar20 = puVar15;
          if (puVar15 < puVar1) {
            uVar30 = *puVar15 ^ *puVar28;
            uVar35 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
            if (*puVar28 == *puVar15) {
              puVar20 = (ulong *)((long)puVar18 + uVar39 + 0xc);
              puVar28 = (ulong *)((long)piVar34 + uVar39 + 0xc);
              do {
                if (puVar1 <= puVar20) goto LAB_00111874;
                uVar30 = *puVar28;
                uVar33 = *puVar20;
                uVar31 = uVar33 ^ uVar30;
                uVar35 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar15);
                puVar20 = puVar20 + 1;
                puVar28 = puVar28 + 1;
              } while (uVar30 == uVar33);
            }
          }
          else {
LAB_00111874:
            if ((puVar20 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar28 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar28 = (ulong *)((long)puVar28 + 4);
            }
            if ((puVar20 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar28 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar28 = (ulong *)((long)puVar28 + 2);
            }
            if (puVar20 < puVar2) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar28 == (char)*puVar20));
            }
            uVar35 = (long)puVar20 - (long)puVar15;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00112a23;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
          uVar30 = (long)puVar18 - (long)puVar22;
          puVar20 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar30))
          goto LAB_00112a42;
          if (puVar2 < puVar18) goto LAB_00112a61;
          if (puVar17 < puVar18) {
            ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)puVar22,(BYTE *)puVar18,(BYTE *)puVar17);
          }
          else {
            uVar33 = puVar22[1];
            *puVar20 = *puVar22;
            puVar20[1] = uVar33;
            if (0x10 < uVar30) {
              pBVar9 = seqStore->lit;
              puVar20 = (ulong *)(pBVar9 + 0x10);
              puVar15 = puVar22 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar20 + (-8 - (long)puVar15)))
              goto LAB_00112b3a;
              if (0xffffffffffffffe0 < (ulong)((long)puVar20 + (-0x10 - (long)puVar15)))
              goto LAB_00112b59;
              uVar33 = puVar22[3];
              *puVar20 = *puVar15;
              *(ulong *)(pBVar9 + 0x18) = uVar33;
              if (0x20 < (long)uVar30) {
                lVar21 = 0;
                do {
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x20);
                  uVar12 = puVar5[1];
                  pBVar3 = pBVar9 + lVar21 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar12;
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x30);
                  uVar12 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar12;
                  lVar21 = lVar21 + 0x20;
                } while (pBVar3 + 0x20 < pBVar9 + uVar30);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) goto LAB_00112add;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = uVar39 + uVar35 + 1;
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar30;
          psVar10->offset = iVar23 + 1;
          if (0xffff < uVar33) {
            if (seqStore->longLengthID != 0) goto LAB_00112a9f;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->matchLength = (U16)uVar33;
          seqStore->sequences = psVar10 + 1;
          puVar20 = (ulong *)((long)puVar18 + uVar39 + uVar35 + 4);
          puVar15 = (ulong *)((long)puVar18 + uVar39 + uVar35 + 5);
          puVar22 = puVar20;
          if (puVar4 < puVar20) goto LAB_00111a4c;
          uVar39 = (ulong)local_dc;
          if (pBVar7 + (uVar40 & 0xffffffff) + 2 <= src) goto LAB_00112afc;
          pUVar8[(ulong)(*(long *)(pBVar7 + (uVar40 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                 (bVar16 & 0x3f)] = UVar37 + 2;
          pUVar8[(ulong)(*(long *)((long)puVar20 - 2) * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
               ((int)puVar20 + -2) - iVar36;
          if (((local_dc != 0) && (puVar20 <= puVar4)) &&
             (uVar27 = uVar24, uVar35 = uVar39, (int)*puVar20 == *(int *)((long)puVar20 - uVar39)))
          {
            do {
              uVar24 = local_dc;
              local_dc = uVar27;
              puVar15 = puVar20;
              uVar39 = (ulong)local_dc;
              puVar20 = (ulong *)((long)puVar15 + 4);
              puVar18 = (ulong *)((long)puVar15 + (4 - uVar35));
              puVar22 = puVar20;
              if (puVar20 < puVar1) {
                uVar33 = *puVar20 ^ *puVar18;
                uVar30 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
                if (*puVar18 == *puVar20) {
                  puVar22 = (ulong *)((long)puVar15 + 0xc);
                  puVar18 = (ulong *)((long)puVar15 + (0xc - uVar35));
                  do {
                    if (puVar1 <= puVar22) goto LAB_00111b5f;
                    uVar35 = *puVar18;
                    uVar33 = *puVar22;
                    uVar40 = uVar33 ^ uVar35;
                    uVar30 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    uVar30 = (long)puVar22 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar20);
                    puVar22 = puVar22 + 1;
                    puVar18 = puVar18 + 1;
                  } while (uVar35 == uVar33);
                }
              }
              else {
LAB_00111b5f:
                if ((puVar22 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar18 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar22 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar18 == (short)*puVar22)
                   ) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar22 < puVar2) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar18 == (char)*puVar22));
                }
                uVar30 = (long)puVar22 - (long)puVar20;
              }
              pUVar8[*puVar15 * -0x30e4432340650000 >> (bVar16 & 0x3f)] = (int)puVar15 - iVar36;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00112a23;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
              puVar20 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_00112a42;
              if (puVar2 < puVar15) goto LAB_00112a61;
              if (puVar17 < puVar15) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar17);
              }
              else {
                uVar35 = puVar15[1];
                *puVar20 = *puVar15;
                puVar20[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offset = 1;
              if (0xffff < uVar30 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00112a9f;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar20 = (ulong *)((long)puVar15 + uVar30 + 4);
              psVar10->matchLength = (U16)(uVar30 + 1);
              seqStore->sequences = psVar10 + 1;
            } while (((local_dc != 0) && (puVar20 <= puVar4)) &&
                    (uVar27 = uVar24, uVar35 = uVar39,
                    (int)*puVar20 == *(int *)((long)puVar20 - uVar39)));
            puVar15 = (ulong *)((long)puVar15 + uVar30 + 5);
            puVar22 = puVar20;
          }
        }
        uVar38 = (uint)uVar39;
      } while (puVar15 < puVar4);
    }
  }
  else if (uVar27 == 7) {
    if (puVar15 < puVar4) {
      bVar16 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar17 = puVar2 + -4;
      do {
        local_dc = (uint)uVar39;
        uVar30 = *puVar20 * -0x30e44323405a9d00 >> (bVar16 & 0x3f);
        uVar33 = *puVar15 * -0x30e44323405a9d00 >> (bVar16 & 0x3f);
        uVar39 = *puVar20;
        uVar35 = *puVar15;
        uVar40 = (long)puVar20 - (long)pBVar7;
        uVar27 = pUVar8[uVar30];
        uVar38 = pUVar8[uVar33];
        UVar37 = (U32)uVar40;
        pUVar8[uVar30] = UVar37;
        pUVar8[uVar33] = (int)puVar15 - iVar36;
        if ((ulong *)((long)puVar20 + 1U) != puVar15) {
LAB_00112abe:
          __assert_fail("ip0 + 1 == ip1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d56,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if (uVar24 == 0) {
LAB_00111080:
          if (((uVar11 < uVar27) &&
              (piVar34 = (int *)(pBVar7 + uVar27), puVar18 = puVar20, *piVar34 == (int)uVar39)) ||
             ((uVar11 < uVar38 &&
              (piVar34 = (int *)(pBVar7 + uVar38), puVar18 = puVar15, *piVar34 == (int)uVar35)))) {
            uVar27 = (int)puVar18 - (int)piVar34;
            iVar23 = uVar27 + 2;
            local_dc = uVar24;
            if ((piVar25 < piVar34) && (puVar22 < puVar18)) {
              uVar39 = 0;
              do {
                piVar19 = (int *)((long)piVar34 + -1);
                puVar20 = (ulong *)((long)puVar18 + -1);
                if ((*(char *)puVar20 != *(char *)piVar19) ||
                   (uVar39 = uVar39 + 1, piVar34 = piVar19, puVar18 = puVar20, piVar19 <= piVar25))
                break;
              } while (puVar22 < puVar20);
            }
            else {
              uVar39 = 0;
            }
            goto LAB_00111146;
          }
          uVar39 = ((ulong)((long)puVar20 - (long)puVar22) >> 7) + uVar14;
          if (uVar39 < 2) {
LAB_00112b1b:
            __assert_fail("step >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d6a,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          puVar20 = (ulong *)((long)puVar20 + uVar39);
          puVar15 = (ulong *)((long)puVar15 + uVar39);
LAB_0011139d:
          uVar39 = (ulong)local_dc;
        }
        else {
          piVar19 = (int *)((long)puVar20 + 2);
          piVar34 = (int *)((long)piVar19 - (ulong)uVar24);
          if (*piVar34 != *piVar19) goto LAB_00111080;
          uVar39 = (ulong)(*(char *)((long)puVar20 + 1U) == *(char *)((long)piVar34 + -1));
          iVar23 = 0;
          piVar34 = (int *)((long)piVar34 - uVar39);
          puVar18 = (ulong *)((long)piVar19 - uVar39);
          uVar27 = uVar24;
LAB_00111146:
          uVar24 = uVar27;
          puVar15 = (ulong *)((long)puVar18 + uVar39 + 4);
          puVar28 = (ulong *)((long)piVar34 + uVar39 + 4);
          puVar20 = puVar15;
          if (puVar15 < puVar1) {
            uVar30 = *puVar15 ^ *puVar28;
            uVar35 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            uVar35 = uVar35 >> 3 & 0x1fffffff;
            if (*puVar28 == *puVar15) {
              puVar20 = (ulong *)((long)puVar18 + uVar39 + 0xc);
              puVar28 = (ulong *)((long)piVar34 + uVar39 + 0xc);
              do {
                if (puVar1 <= puVar20) goto LAB_001111c5;
                uVar30 = *puVar28;
                uVar33 = *puVar20;
                uVar31 = uVar33 ^ uVar30;
                uVar35 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = (long)puVar20 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar15);
                puVar20 = puVar20 + 1;
                puVar28 = puVar28 + 1;
              } while (uVar30 == uVar33);
            }
          }
          else {
LAB_001111c5:
            if ((puVar20 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar28 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar28 = (ulong *)((long)puVar28 + 4);
            }
            if ((puVar20 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar28 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar28 = (ulong *)((long)puVar28 + 2);
            }
            if (puVar20 < puVar2) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar28 == (char)*puVar20));
            }
            uVar35 = (long)puVar20 - (long)puVar15;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00112a23:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_00112a80:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar30 = (long)puVar18 - (long)puVar22;
          puVar20 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar30)) {
LAB_00112a42:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar2 < puVar18) {
LAB_00112a61:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar17 < puVar18) {
            ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)puVar22,(BYTE *)puVar18,(BYTE *)puVar17);
          }
          else {
            uVar33 = puVar22[1];
            *puVar20 = *puVar22;
            puVar20[1] = uVar33;
            if (0x10 < uVar30) {
              pBVar9 = seqStore->lit;
              puVar20 = (ulong *)(pBVar9 + 0x10);
              puVar15 = puVar22 + 2;
              if (0xffffffffffffffe8 < (ulong)((long)puVar20 + (-8 - (long)puVar15))) {
LAB_00112b3a:
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (0xffffffffffffffe0 < (ulong)((long)puVar20 + (-0x10 - (long)puVar15))) {
LAB_00112b59:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar33 = puVar22[3];
              *puVar20 = *puVar15;
              *(ulong *)(pBVar9 + 0x18) = uVar33;
              if (0x20 < (long)uVar30) {
                lVar21 = 0;
                do {
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x20);
                  uVar12 = puVar5[1];
                  pBVar3 = pBVar9 + lVar21 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar12;
                  puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x30);
                  uVar12 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar12;
                  lVar21 = lVar21 + 0x20;
                } while (pBVar3 + 0x20 < pBVar9 + uVar30);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) {
LAB_00112add:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar33 = uVar39 + uVar35 + 1;
          psVar10 = seqStore->sequences;
          psVar10->litLength = (U16)uVar30;
          psVar10->offset = iVar23 + 1;
          if (0xffff < uVar33) {
            if (seqStore->longLengthID != 0) {
LAB_00112a9f:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar10->matchLength = (U16)uVar33;
          seqStore->sequences = psVar10 + 1;
          puVar20 = (ulong *)((long)puVar18 + uVar39 + uVar35 + 4);
          puVar15 = (ulong *)((long)puVar18 + uVar39 + uVar35 + 5);
          puVar22 = puVar20;
          if (puVar4 < puVar20) goto LAB_0011139d;
          uVar39 = (ulong)local_dc;
          if (pBVar7 + (uVar40 & 0xffffffff) + 2 <= src) {
LAB_00112afc:
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d84,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          pUVar8[(ulong)(*(long *)(pBVar7 + (uVar40 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                 (bVar16 & 0x3f)] = UVar37 + 2;
          pUVar8[(ulong)(*(long *)((long)puVar20 - 2) * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
               ((int)puVar20 + -2) - iVar36;
          if (((local_dc != 0) && (puVar20 <= puVar4)) &&
             (uVar27 = uVar24, uVar35 = uVar39, (int)*puVar20 == *(int *)((long)puVar20 - uVar39)))
          {
            do {
              uVar24 = local_dc;
              local_dc = uVar27;
              puVar15 = puVar20;
              uVar39 = (ulong)local_dc;
              puVar20 = (ulong *)((long)puVar15 + 4);
              puVar18 = (ulong *)((long)puVar15 + (4 - uVar35));
              puVar22 = puVar20;
              if (puVar20 < puVar1) {
                uVar33 = *puVar20 ^ *puVar18;
                uVar30 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
                if (*puVar18 == *puVar20) {
                  puVar22 = (ulong *)((long)puVar15 + 0xc);
                  puVar18 = (ulong *)((long)puVar15 + (0xc - uVar35));
                  do {
                    if (puVar1 <= puVar22) goto LAB_001114b0;
                    uVar35 = *puVar18;
                    uVar33 = *puVar22;
                    uVar40 = uVar33 ^ uVar35;
                    uVar30 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    uVar30 = (long)puVar22 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar20);
                    puVar22 = puVar22 + 1;
                    puVar18 = puVar18 + 1;
                  } while (uVar35 == uVar33);
                }
              }
              else {
LAB_001114b0:
                if ((puVar22 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar18 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar22 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar18 == (short)*puVar22)
                   ) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar22 < puVar2) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar18 == (char)*puVar22));
                }
                uVar30 = (long)puVar22 - (long)puVar20;
              }
              pUVar8[*puVar15 * -0x30e44323405a9d00 >> (bVar16 & 0x3f)] = (int)puVar15 - iVar36;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00112a23;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
              puVar20 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_00112a42;
              if (puVar2 < puVar15) goto LAB_00112a61;
              if (puVar17 < puVar15) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar17);
              }
              else {
                uVar35 = puVar15[1];
                *puVar20 = *puVar15;
                puVar20[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offset = 1;
              if (0xffff < uVar30 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00112a9f;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar20 = (ulong *)((long)puVar15 + uVar30 + 4);
              psVar10->matchLength = (U16)(uVar30 + 1);
              seqStore->sequences = psVar10 + 1;
            } while (((local_dc != 0) && (puVar20 <= puVar4)) &&
                    (uVar27 = uVar24, uVar35 = uVar39,
                    (int)*puVar20 == *(int *)((long)puVar20 - uVar39)));
            puVar15 = (ulong *)((long)puVar15 + uVar30 + 5);
            puVar22 = puVar20;
          }
        }
        uVar38 = (uint)uVar39;
      } while (puVar15 < puVar4);
    }
  }
  else if (puVar15 < puVar4) {
    bVar16 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 - 7);
    puVar17 = puVar2 + -4;
    do {
      uVar35 = *puVar20;
      uVar29 = (uint)((int)uVar35 * -0x61c8864f) >> (bVar16 & 0x1f);
      uVar30 = *puVar15;
      uVar32 = (uint)((int)uVar30 * -0x61c8864f) >> (bVar16 & 0x1f);
      uVar33 = (long)puVar20 - (long)pBVar7;
      uVar27 = pUVar8[uVar29];
      uVar38 = pUVar8[uVar32];
      UVar37 = (U32)uVar33;
      pUVar8[uVar29] = UVar37;
      pUVar8[uVar32] = (int)puVar15 - iVar36;
      if ((ulong *)((long)puVar20 + 1U) != puVar15) goto LAB_00112abe;
      if (uVar24 == 0) {
LAB_00112463:
        if (((uVar11 < uVar27) &&
            (piVar34 = (int *)(pBVar7 + uVar27), puVar18 = puVar20, *piVar34 == (int)uVar35)) ||
           ((uVar11 < uVar38 &&
            (piVar34 = (int *)(pBVar7 + uVar38), puVar18 = puVar15, *piVar34 == (int)uVar30)))) {
          uVar27 = (int)puVar18 - (int)piVar34;
          iVar23 = uVar27 + 2;
          local_dc = uVar24;
          if ((piVar25 < piVar34) && (puVar22 < puVar18)) {
            uVar35 = 0;
            do {
              piVar19 = (int *)((long)piVar34 + -1);
              puVar20 = (ulong *)((long)puVar18 + -1);
              if ((*(char *)puVar20 != *(char *)piVar19) ||
                 (uVar35 = uVar35 + 1, piVar34 = piVar19, puVar18 = puVar20, piVar19 <= piVar25))
              break;
            } while (puVar22 < puVar20);
          }
          else {
            uVar35 = 0;
          }
          goto LAB_00112523;
        }
        uVar35 = ((ulong)((long)puVar20 - (long)puVar22) >> 7) + uVar14;
        if (uVar35 < 2) goto LAB_00112b1b;
        puVar20 = (ulong *)((long)puVar20 + uVar35);
        puVar15 = (ulong *)((long)puVar15 + uVar35);
      }
      else {
        piVar19 = (int *)((long)puVar20 + 2);
        piVar34 = (int *)((long)piVar19 - (ulong)uVar24);
        if (*piVar34 != *piVar19) goto LAB_00112463;
        uVar35 = (ulong)(*(char *)((long)puVar20 + 1U) == *(char *)((long)piVar34 + -1));
        iVar23 = 0;
        piVar34 = (int *)((long)piVar34 - uVar35);
        puVar18 = (ulong *)((long)piVar19 - uVar35);
        local_dc = (uint)uVar39;
        uVar27 = uVar24;
LAB_00112523:
        uVar24 = uVar27;
        puVar15 = (ulong *)((long)puVar18 + uVar35 + 4);
        puVar28 = (ulong *)((long)piVar34 + uVar35 + 4);
        puVar20 = puVar15;
        if (puVar15 < puVar1) {
          uVar30 = *puVar15 ^ *puVar28;
          uVar39 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar39 = uVar39 >> 3 & 0x1fffffff;
          if (*puVar28 == *puVar15) {
            puVar20 = (ulong *)((long)puVar18 + uVar35 + 0xc);
            puVar28 = (ulong *)((long)piVar34 + uVar35 + 0xc);
            do {
              if (puVar1 <= puVar20) goto LAB_001125a6;
              uVar30 = *puVar28;
              uVar40 = *puVar20;
              uVar31 = uVar40 ^ uVar30;
              uVar39 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar39 = (long)puVar20 + ((uVar39 >> 3 & 0x1fffffff) - (long)puVar15);
              puVar20 = puVar20 + 1;
              puVar28 = puVar28 + 1;
            } while (uVar30 == uVar40);
          }
        }
        else {
LAB_001125a6:
          if ((puVar20 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar28 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar28 = (ulong *)((long)puVar28 + 4);
          }
          if ((puVar20 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar28 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar28 = (ulong *)((long)puVar28 + 2);
          }
          if (puVar20 < puVar2) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar28 == (char)*puVar20));
          }
          uVar39 = (long)puVar20 - (long)puVar15;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00112a23;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
        uVar30 = (long)puVar18 - (long)puVar22;
        puVar20 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar30))
        goto LAB_00112a42;
        if (puVar2 < puVar18) goto LAB_00112a61;
        if (puVar17 < puVar18) {
          ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)puVar22,(BYTE *)puVar18,(BYTE *)puVar17);
        }
        else {
          uVar40 = puVar22[1];
          *puVar20 = *puVar22;
          puVar20[1] = uVar40;
          if (0x10 < uVar30) {
            pBVar9 = seqStore->lit;
            puVar20 = (ulong *)(pBVar9 + 0x10);
            puVar15 = puVar22 + 2;
            if (0xffffffffffffffe8 < (ulong)((long)puVar20 + (-8 - (long)puVar15)))
            goto LAB_00112b3a;
            if (0xffffffffffffffe0 < (ulong)((long)puVar20 + (-0x10 - (long)puVar15)))
            goto LAB_00112b59;
            uVar40 = puVar22[3];
            *puVar20 = *puVar15;
            *(ulong *)(pBVar9 + 0x18) = uVar40;
            if (0x20 < (long)uVar30) {
              lVar21 = 0;
              do {
                puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x20);
                uVar12 = puVar5[1];
                pBVar3 = pBVar9 + lVar21 + 0x20;
                *(undefined8 *)pBVar3 = *puVar5;
                *(undefined8 *)(pBVar3 + 8) = uVar12;
                puVar5 = (undefined8 *)((long)puVar22 + lVar21 + 0x30);
                uVar12 = puVar5[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar3 + 0x18) = uVar12;
                lVar21 = lVar21 + 0x20;
              } while (pBVar3 + 0x20 < pBVar9 + uVar30);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar30;
        if (0xffff < uVar30) {
          if (seqStore->longLengthID != 0) goto LAB_00112add;
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        uVar40 = uVar35 + uVar39 + 1;
        psVar10 = seqStore->sequences;
        psVar10->litLength = (U16)uVar30;
        psVar10->offset = iVar23 + 1;
        if (0xffff < uVar40) {
          if (seqStore->longLengthID != 0) goto LAB_00112a9f;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar10->matchLength = (U16)uVar40;
        seqStore->sequences = psVar10 + 1;
        puVar20 = (ulong *)((long)puVar18 + uVar35 + uVar39 + 4);
        puVar15 = (ulong *)((long)puVar18 + uVar35 + uVar39 + 5);
        puVar22 = puVar20;
        if (puVar4 < puVar20) {
          uVar39 = (ulong)local_dc;
        }
        else {
          uVar39 = (ulong)local_dc;
          if (pBVar7 + (uVar33 & 0xffffffff) + 2 <= src) goto LAB_00112afc;
          pUVar8[(uint)(*(int *)(pBVar7 + (uVar33 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar16 & 0x1f)] = UVar37 + 2;
          pUVar8[(uint)(*(int *)((long)puVar20 - 2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               ((int)puVar20 + -2) - iVar36;
          if (((local_dc != 0) && (puVar20 <= puVar4)) &&
             (iVar23 = (int)*puVar20, uVar27 = uVar24, uVar35 = uVar39,
             iVar23 == *(int *)((long)puVar20 - uVar39))) {
            do {
              uVar24 = local_dc;
              local_dc = uVar27;
              puVar15 = puVar20;
              uVar39 = (ulong)local_dc;
              puVar20 = (ulong *)((long)puVar15 + 4);
              puVar18 = (ulong *)((long)puVar15 + (4 - uVar35));
              puVar22 = puVar20;
              if (puVar20 < puVar1) {
                uVar33 = *puVar20 ^ *puVar18;
                uVar30 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
                if (*puVar18 == *puVar20) {
                  puVar22 = (ulong *)((long)puVar15 + 0xc);
                  puVar18 = (ulong *)((long)puVar15 + (0xc - uVar35));
                  do {
                    if (puVar1 <= puVar22) goto LAB_0011287d;
                    uVar35 = *puVar18;
                    uVar33 = *puVar22;
                    uVar40 = uVar33 ^ uVar35;
                    uVar30 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    uVar30 = (long)puVar22 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar20);
                    puVar22 = puVar22 + 1;
                    puVar18 = puVar18 + 1;
                  } while (uVar35 == uVar33);
                }
              }
              else {
LAB_0011287d:
                if ((puVar22 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar18 == (int)*puVar22)) {
                  puVar22 = (ulong *)((long)puVar22 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar22 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar18 == (short)*puVar22)
                   ) {
                  puVar22 = (ulong *)((long)puVar22 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar22 < puVar2) {
                  puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar18 == (char)*puVar22));
                }
                uVar30 = (long)puVar22 - (long)puVar20;
              }
              pUVar8[(uint)(iVar23 * -0x61c8864f) >> (bVar16 & 0x1f)] = (int)puVar15 - iVar36;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00112a23;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00112a80;
              puVar20 = (ulong *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_00112a42;
              if (puVar2 < puVar15) goto LAB_00112a61;
              if (puVar17 < puVar15) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar20,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar17);
              }
              else {
                uVar35 = puVar15[1];
                *puVar20 = *puVar15;
                puVar20[1] = uVar35;
              }
              psVar10 = seqStore->sequences;
              psVar10->litLength = 0;
              psVar10->offset = 1;
              if (0xffff < uVar30 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_00112a9f;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
              }
              puVar20 = (ulong *)((long)puVar15 + uVar30 + 4);
              psVar10->matchLength = (U16)(uVar30 + 1);
              seqStore->sequences = psVar10 + 1;
            } while (((local_dc != 0) && (puVar20 <= puVar4)) &&
                    (iVar23 = (int)*puVar20, uVar27 = uVar24, uVar35 = uVar39,
                    iVar23 == *(int *)((long)puVar20 - uVar39)));
            puVar15 = (ulong *)((long)puVar15 + uVar30 + 5);
            puVar22 = puVar20;
          }
        }
      }
      uVar38 = (uint)uVar39;
    } while (puVar15 < puVar4);
  }
  uVar27 = 0;
  if (uVar26 < uVar13) {
    uVar27 = uVar13;
  }
  if (uVar26 < uVar6) {
    uVar27 = uVar6;
  }
  if (uVar24 == 0) {
    uVar24 = uVar27;
  }
  if (uVar38 != 0) {
    uVar27 = uVar38;
  }
  *rep = uVar24;
  rep[1] = uVar27;
  return (long)puVar2 - (long)puVar22;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}